

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O1

vec2 __thiscall rengine::SDLBackend::dpi(SDLBackend *this)

{
  vec2 vVar1;
  undefined4 uVar2;
  float fVar3;
  int local_3c;
  undefined1 local_38 [4];
  int dw;
  int dh;
  int ww;
  int wh;
  float d;
  float h;
  float v;
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x112,"virtual vec2 rengine::SDLBackend::dpi() const");
  }
  if (this->m_surface != (Surface *)0x0) {
    uVar2 = SDL_GetWindowDisplayIndex();
    SDL_GetDisplayDPI(uVar2,&ww,&wh,&d);
    SDL_GetWindowSize(this->m_window,&dw,&dh);
    SDL_GL_GetDrawableSize(this->m_window,&local_3c,local_38);
    fVar3 = (float)((long)local_3c / (long)dw & 0xffffffff);
    vVar1.y = d * fVar3;
    vVar1.x = (float)wh * fVar3;
    return vVar1;
  }
  __assert_fail("m_surface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0x113,"virtual vec2 rengine::SDLBackend::dpi() const");
}

Assistant:

inline vec2 SDLBackend::dpi() const
{
    assert(m_window);
    assert(m_surface);
    int index = SDL_GetWindowDisplayIndex(m_window);
    float d, h, v;
    SDL_GetDisplayDPI(index, &d, &h, &v);
    return vec2(h, v) * devicePixelRatio();
}